

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O0

void __thiscall Arena_PtrNoConNoDecon_Test::TestBody(Arena_PtrNoConNoDecon_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_1e8;
  Message local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_140;
  Message local_138;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
  ptr4;
  PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
  ptr3;
  PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
  ptr2;
  AssertHelper local_c8;
  Message local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar__1;
  PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
  ptr1;
  string local_88;
  AssertHelper local_68;
  Message local_60 [3];
  bool local_41;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  Arena arena;
  Arena_PtrNoConNoDecon_Test *this_local;
  
  memt::Arena::Arena((Arena *)&gtest_ar_.message_);
  local_41 = memt::Arena::isEmpty((Arena *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_40,&local_41,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_88,(internal *)local_40,(AssertionResult *)"arena.isEmpty()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0xd0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (bVar1) {
    memt::Arena::
    PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
    ::PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                       *)&gtest_ar__1.message_,(Arena *)&gtest_ar_.message_);
    bVar1 = memt::Arena::isEmpty((Arena *)&gtest_ar_.message_);
    local_b1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_b0,&local_b1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar1) {
      testing::Message::Message(&local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&ptr2.mPtr,(internal *)local_b0,(AssertionResult *)"arena.isEmpty()",
                 "true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0xd3,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      std::__cxx11::string::~string((string *)&ptr2.mPtr);
      testing::Message::~Message(&local_c0);
    }
    bVar1 = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    if (!bVar1) {
      memt::Arena::
      PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
      ::PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                         *)&ptr3.mPtr,(Arena *)&gtest_ar_.message_);
      memt::Arena::
      PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
      ::PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                         *)&ptr4.mPtr,(Arena *)&gtest_ar_.message_);
      memt::Arena::
      PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
      ::PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                         *)&gtest_ar__2.message_,(Arena *)&gtest_ar_.message_);
      bVar1 = memt::Arena::isEmpty((Arena *)&gtest_ar_.message_);
      local_129 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_128,&local_129,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
      if (!bVar1) {
        testing::Message::Message(&local_138);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_128,
                   (AssertionResult *)"arena.isEmpty()","true","false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                   ,0xd7,pcVar2);
        testing::internal::AssertHelper::operator=(&local_140,&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_138);
      }
      bVar1 = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
      memt::Arena::
      PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
      ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                          *)&gtest_ar__2.message_);
      memt::Arena::
      PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
      ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                          *)&ptr4.mPtr);
      memt::Arena::
      PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
      ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                          *)&ptr3.mPtr);
    }
    memt::Arena::
    PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
    ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                        *)&gtest_ar__1.message_);
    if (!bVar1) {
      local_171 = memt::Arena::isEmpty((Arena *)&gtest_ar_.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_170,&local_171,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
      if (!bVar1) {
        testing::Message::Message(&local_180);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_170,
                   (AssertionResult *)"arena.isEmpty()","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_188,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                   ,0xd9,pcVar2);
        testing::internal::AssertHelper::operator=(&local_188,&local_180);
        testing::internal::AssertHelper::~AssertHelper(&local_188);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_180);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
      if (bVar1) {
        (anonymous_namespace)::
        _frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,0ul>::
        resetLog_abi_cxx11_();
        testing::internal::EqHelper::
        Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[1],_nullptr>
                  ((EqHelper *)local_1b8,"PtrNoConNoDeconHelper::resetLog()","\"\"",&local_1d8,
                   (char (*) [1])0x175f40);
        std::__cxx11::string::~string((string *)&local_1d8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
        if (!bVar1) {
          testing::Message::Message(&local_1e0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1e8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                     ,0xda,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
          testing::internal::AssertHelper::~AssertHelper(&local_1e8);
          testing::Message::~Message(&local_1e0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
      }
    }
  }
  memt::Arena::~Arena((Arena *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(Arena, PtrNoConNoDecon) {
  memt::Arena arena;
  ASSERT_TRUE(arena.isEmpty());
  {
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr1(arena);
	ASSERT_FALSE(arena.isEmpty());
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr2(arena);
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr3(arena);
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr4(arena);
	ASSERT_FALSE(arena.isEmpty());
  }
  ASSERT_TRUE(arena.isEmpty());
  ASSERT_EQ(PtrNoConNoDeconHelper::resetLog(), "");
}